

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void linspace(double *x,int N,double xlo,double xhi)

{
  ulong uVar1;
  
  *x = xlo;
  x[(long)N + -1] = xhi;
  if (2 < N) {
    uVar1 = 1;
    do {
      x[uVar1] = (double)(int)uVar1 * ((xhi - xlo) / (double)(int)(N - 1U)) + xlo;
      uVar1 = uVar1 + 1;
    } while (N - 1U != uVar1);
  }
  return;
}

Assistant:

void linspace(double *x, int N,double xlo,double xhi) {
    int i;
    double intv;

    intv = (xhi - xlo)/(double)(N-1);
    x[0] = xlo;
    x[N-1] = xhi;

    for(i = 1; i < N-1;++i) {
        x[i] = xlo + intv * (double) i;
    }
}